

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarCloseTab(ImGuiTabBar *tab_bar,ImGuiTabItem *tab)

{
  if (((uint)tab->Flags >> 0x15 & 1) != 0) {
    __assert_fail("!(tab->Flags & ImGuiTabItemFlags_Button)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x1dc2,"void ImGui::TabBarCloseTab(ImGuiTabBar *, ImGuiTabItem *)");
  }
  if ((tab->Flags & 1U) == 0) {
    tab->WantClose = true;
    if (tab_bar->VisibleTabId == tab->ID) {
      tab->LastFrameVisible = -1;
      tab_bar->SelectedTabId = 0;
      tab_bar->NextSelectedTabId = 0;
      return;
    }
  }
  else if (tab_bar->VisibleTabId != tab->ID) {
    tab_bar->NextSelectedTabId = tab->ID;
  }
  return;
}

Assistant:

void ImGui::TabBarCloseTab(ImGuiTabBar* tab_bar, ImGuiTabItem* tab)
{
    IM_ASSERT(!(tab->Flags & ImGuiTabItemFlags_Button));
    if (!(tab->Flags & ImGuiTabItemFlags_UnsavedDocument))
    {
        // This will remove a frame of lag for selecting another tab on closure.
        // However we don't run it in the case where the 'Unsaved' flag is set, so user gets a chance to fully undo the closure
        tab->WantClose = true;
        if (tab_bar->VisibleTabId == tab->ID)
        {
            tab->LastFrameVisible = -1;
            tab_bar->SelectedTabId = tab_bar->NextSelectedTabId = 0;
        }
    }
    else
    {
        // Actually select before expecting closure attempt (on an UnsavedDocument tab user is expect to e.g. show a popup)
        if (tab_bar->VisibleTabId != tab->ID)
            tab_bar->NextSelectedTabId = tab->ID;
    }
}